

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_tuple_primitive_setIdentityHash
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  int iVar2;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  if (*arguments == 0 || (*arguments & 0xf) != 0) {
    sysbvm_error("Cannot set the identity hash of an immediate value.");
  }
  uVar1 = arguments[1];
  if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
    iVar2 = (int)((long)uVar1 >> 4);
  }
  else {
    iVar2 = (int)*(undefined8 *)(uVar1 + 0x10);
  }
  *(uint *)(*arguments + 8) = iVar2 << 10 | *(uint *)(*arguments + 8) & 0x3ff;
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_setIdentityHash(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);
    if(!sysbvm_tuple_isNonNullPointer(arguments[0])) sysbvm_error("Cannot set the identity hash of an immediate value.");

    sysbvm_tuple_setIdentityHash((sysbvm_object_tuple_t*)arguments[0], sysbvm_tuple_size_decode(arguments[1]));
    return SYSBVM_VOID_TUPLE;
}